

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_array.h
# Opt level: O2

void __thiscall
tlm::tlm_array<tlm::tlm_extension_base_*>::free_entire_cache
          (tlm_array<tlm::tlm_extension_base_*> *this)

{
  pointer puVar1;
  pointer pptVar2;
  unsigned_long uVar3;
  
  puVar1 = (this->m_entries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while (puVar1 != (this->m_entries).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    uVar3 = puVar1[-1];
    pptVar2 = (this->
              super_vector<tlm::tlm_extension_base_*,_std::allocator<tlm::tlm_extension_base_*>_>).
              super__Vector_base<tlm::tlm_extension_base_*,_std::allocator<tlm::tlm_extension_base_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pptVar2[uVar3] != (tlm_extension_base *)0x0) {
      (**(code **)(*(long *)pptVar2[uVar3] + 8))();
      pptVar2 = (this->
                super_vector<tlm::tlm_extension_base_*,_std::allocator<tlm::tlm_extension_base_*>_>)
                .
                super__Vector_base<tlm::tlm_extension_base_*,_std::allocator<tlm::tlm_extension_base_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (this->m_entries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1];
    }
    pptVar2[uVar3] = (tlm_extension_base *)0x0;
    puVar1 = (this->m_entries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
    (this->m_entries).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void free_entire_cache()
    {
        while(m_entries.size())
        {
            if ((*this)[m_entries.back()])      //we make sure no one cleared the slot manually
              (*this)[m_entries.back()]->free();//...and then we call free on the content of the slot
            (*this)[m_entries.back()]=0;        //afterwards we set the slot to NULL
            m_entries.pop_back();
        }
    }